

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O3

void __thiscall
ON_3dmObjectAttributes::SetHatchBackgroundFillColor(ON_3dmObjectAttributes *this,ON_Color *color)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ON_Color *pOVar4;
  ON_3dmObjectAttributesPrivate *this_00;
  ON_Color c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_20;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  
  local_20 = color->field_0;
  iVar1 = ON_Color::Alpha((ON_Color *)&local_20);
  if (iVar1 == 0xff) {
    local_20 = ON_Color::UnsetColor.field_0;
  }
  if (this->m_private == (ON_3dmObjectAttributesPrivate *)0x0) {
    pOVar4 = &ON_Color::UnsetColor;
  }
  else {
    pOVar4 = &this->m_private->m_hatch_background_fill;
  }
  local_1c = pOVar4->field_0;
  uVar2 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_1c);
  uVar3 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_20);
  if (uVar2 != uVar3) {
    this_00 = this->m_private;
    if (this_00 == (ON_3dmObjectAttributesPrivate *)0x0) {
      this_00 = (ON_3dmObjectAttributesPrivate *)operator_new(0x158);
      ON_3dmObjectAttributesPrivate::ON_3dmObjectAttributesPrivate(this_00,this);
      this->m_private = this_00;
    }
    (this_00->m_hatch_background_fill).field_0 = local_20;
  }
  return;
}

Assistant:

void ON_3dmObjectAttributes::SetHatchBackgroundFillColor(const ON_Color& color)
{
  ON_Color c = color;
  if (c.Alpha() == 255)
    c = ON_Color::UnsetColor;
  if (HatchBackgroundFillColor() == c)
    return;

  if (nullptr == m_private)
    m_private = new ON_3dmObjectAttributesPrivate(this);
  m_private->m_hatch_background_fill = c;
}